

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_78::BinaryReaderIR::PushLabel
          (BinaryReaderIR *this,LabelType label_type,ExprList *first,Expr *context)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pLVar3;
  ExprList *pEVar4;
  undefined4 uVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pLVar8;
  pointer pLVar9;
  ulong uVar10;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar1 == (this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pLVar2 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pLVar1 - (long)pLVar2 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar6 = ((long)pLVar1 - (long)pLVar2) / 0x18;
    uVar7 = 1;
    if (pLVar1 != pLVar2) {
      uVar7 = uVar6;
    }
    uVar10 = uVar7 + uVar6;
    if (0x555555555555554 < uVar10) {
      uVar10 = 0x555555555555555;
    }
    if (CARRY8(uVar7,uVar6)) {
      uVar10 = 0x555555555555555;
    }
    if (uVar10 == 0) {
      pLVar8 = (pointer)0x0;
    }
    else {
      pLVar8 = (pointer)operator_new(uVar10 * 0x18);
    }
    pLVar8[uVar6].label_type = label_type;
    pLVar8[uVar6].exprs = first;
    pLVar8[uVar6].context = context;
    pLVar3 = pLVar8;
    for (pLVar9 = pLVar2; pLVar9 != pLVar1; pLVar9 = pLVar9 + 1) {
      pLVar3->context = pLVar9->context;
      uVar5 = *(undefined4 *)&pLVar9->field_0x4;
      pEVar4 = pLVar9->exprs;
      pLVar3->label_type = pLVar9->label_type;
      *(undefined4 *)&pLVar3->field_0x4 = uVar5;
      pLVar3->exprs = pEVar4;
      pLVar3 = pLVar3 + 1;
    }
    if (pLVar2 != (pointer)0x0) {
      operator_delete(pLVar2);
    }
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_start = pLVar8;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar3 + 1;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar8 + uVar10;
  }
  else {
    pLVar1->label_type = label_type;
    pLVar1->exprs = first;
    pLVar1->context = context;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar1 + 1;
  }
  return;
}

Assistant:

void BinaryReaderIR::PushLabel(LabelType label_type,
                               ExprList* first,
                               Expr* context) {
  label_stack_.emplace_back(label_type, first, context);
}